

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O2

int main(void)

{
  uint __errnum;
  long lVar1;
  hdr_histogram *phVar2;
  __syscall_slong_t a;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint8_t *puVar9;
  FILE *pFVar10;
  int64_t iVar11;
  int64_t iVar12;
  FILE *file;
  uint *puVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  bool bVar18;
  double dVar19;
  hdr_histogram *read_cor_histogram;
  hdr_log_reader reader;
  hdr_histogram *actual;
  undefined1 local_109;
  hdr_log_writer writer;
  hdr_histogram *histogram;
  hdr_timespec local_f0 [2];
  hdr_histogram **local_d0;
  size_t local_c8;
  double local_c0;
  hdr_histogram *read_raw_histogram;
  char *data;
  int64_t local_a8;
  hdr_timespec local_a0;
  int64_t local_88;
  char *local_80;
  size_t local_78;
  
  tests_run = 0;
  actual = (hdr_histogram *)0x0;
  hdr_alloc(3600000000,3,&histogram);
  iVar4 = hdr_log_encode(histogram,&data);
  pcVar17 = data;
  if (iVar4 == 0) {
    sVar6 = strlen(data);
    iVar4 = hdr_log_decode(&actual,pcVar17,sVar6);
    if (iVar4 != 0) {
      pcVar17 = "Failed to decode histogram data";
      goto LAB_0010160b;
    }
    _Var3 = compare_histogram(histogram,actual);
    if (!_Var3) {
      pcVar17 = "Histograms should be the same";
      goto LAB_0010160b;
    }
    free(histogram);
    free(actual);
    free(data);
    tests_run = tests_run + 1;
    data = (char *)0x0;
    histogram = (hdr_histogram *)0x0;
    actual = (hdr_histogram *)0x0;
    load_histograms();
    phVar2 = raw_histogram;
    iVar4 = hdr_encode_compressed(raw_histogram,(uint8_t **)&data,(size_t *)&histogram);
    _Var3 = validate_return_code(iVar4);
    if (_Var3) {
      iVar4 = hdr_decode_compressed((uint8_t *)data,(size_t)histogram,&actual);
      _Var3 = validate_return_code(iVar4);
      if (!_Var3) {
        pcVar17 = "Did not decode";
        goto LAB_00101676;
      }
      if (actual == (hdr_histogram *)0x0) {
        pcVar17 = "Loaded histogram is null";
        goto LAB_00101676;
      }
      _Var3 = compare_histogram(phVar2,actual);
      if (!_Var3) {
        pcVar17 = "Comparison did not match";
        goto LAB_00101676;
      }
      free(actual);
      tests_run = tests_run + 1;
      data = (char *)0x0;
      histogram = (hdr_histogram *)0x0;
      actual = (hdr_histogram *)0x0;
      load_histograms();
      phVar2 = cor_histogram;
      iVar4 = hdr_encode_compressed(cor_histogram,(uint8_t **)&data,(size_t *)&histogram);
      _Var3 = validate_return_code(iVar4);
      if (_Var3) {
        iVar4 = hdr_decode_compressed((uint8_t *)data,(size_t)histogram,&actual);
        _Var3 = validate_return_code(iVar4);
        if (!_Var3) {
          pcVar17 = "Did not decode";
          goto LAB_001016a1;
        }
        if (actual == (hdr_histogram *)0x0) {
          pcVar17 = "Loaded histogram is null";
          goto LAB_001016a1;
        }
        _Var3 = compare_histogram(phVar2,actual);
        if (!_Var3) {
          pcVar17 = "Comparison did not match";
          goto LAB_001016a1;
        }
        free(actual);
        tests_run = tests_run + 1;
        data = (char *)0x0;
        histogram = (hdr_histogram *)0x0;
        actual = (hdr_histogram *)0x0;
        reader.major_version = 0;
        reader.minor_version = 0;
        lVar15 = 1;
        hdr_init(1,3600000000,4,&histogram);
        srand(5);
        iVar4 = 0x1f86;
        while (phVar2 = histogram, bVar18 = iVar4 != 0, iVar4 = iVar4 + -1, bVar18) {
          iVar5 = rand();
          hdr_record_value(phVar2,(long)iVar5);
        }
        iVar4 = hdr_encode_compressed(histogram,(uint8_t **)&actual,(size_t *)&reader);
        _Var3 = validate_return_code(iVar4);
        if (_Var3) {
          iVar4 = hdr_decode_compressed((uint8_t *)actual,reader._0_8_,(hdr_histogram **)&data);
          _Var3 = validate_return_code(iVar4);
          if (!_Var3) {
            pcVar17 = "Did not decode";
            goto LAB_00101818;
          }
          if (data == (char *)0x0) {
            pcVar17 = "Loaded histogram is null";
            goto LAB_00101818;
          }
          _Var3 = compare_histogram(histogram,(hdr_histogram *)data);
          if (!_Var3) {
            pcVar17 = "Comparison did not match";
            goto LAB_00101818;
          }
          free(histogram);
          free(data);
          tests_run = tests_run + 1;
          data = (char *)0x0;
          histogram = (hdr_histogram *)0x0;
          load_histograms();
          iVar4 = hdr_encode_compressed(cor_histogram,(uint8_t **)&data,(size_t *)&histogram);
          _Var3 = validate_return_code(iVar4);
          if (_Var3) {
            sVar7 = hdr_base64_encoded_len((size_t)histogram);
            sVar8 = hdr_base64_decoded_len(sVar7);
            pcVar17 = (char *)calloc(sVar7 + 1,1);
            puVar9 = (uint8_t *)calloc(sVar8,1);
            hdr_base64_encode((uint8_t *)data,(size_t)histogram,pcVar17,sVar7);
            hdr_base64_decode(pcVar17,sVar7,puVar9,sVar8);
            iVar4 = bcmp(data,puVar9,(size_t)histogram);
            pcVar17 = (char *)0x0;
            if (iVar4 != 0) {
              pcVar17 = "Should be same";
            }
          }
          else {
            pcVar17 = "Did not encode";
          }
          tests_run = tests_run + 1;
          if (pcVar17 != (char *)0x0) {
            pcVar16 = "test_encode_and_decode_base64";
            goto LAB_00101618;
          }
          data = (char *)0x0;
          histogram = (hdr_histogram *)0x0;
          actual = (hdr_histogram *)0x0;
          load_histograms();
          iVar4 = hdr_encode_compressed(cor_histogram,(uint8_t **)&data,(size_t *)&histogram);
          _Var3 = validate_return_code(iVar4);
          if (_Var3) {
            iVar4 = hdr_decode_compressed
                              ((uint8_t *)data,(size_t)((long)&histogram[-1].counts + 7),&actual);
            _Var3 = compare_int64(0x16,(long)iVar4);
            if (_Var3) {
              pcVar17 = "Should not have built histogram";
              if (actual == (hdr_histogram *)0x0) {
                pcVar17 = (char *)0x0;
              }
            }
            else {
              pcVar17 = "Should have be invalid";
            }
          }
          else {
            pcVar17 = "Did not encode";
          }
          tests_run = tests_run + 1;
          if (pcVar17 != (char *)0x0) {
            pcVar16 = "test_bounds_check_on_decode";
            goto LAB_00101618;
          }
          data = (char *)((ulong)data & 0xffffffff00000000);
          hdr_base64_decode_block("TWFu",(uint8_t *)&data);
          _Var3 = compare_string("Man",(char *)&data,3);
          tests_run = tests_run + 1;
          if (!_Var3) {
            pcVar17 = "Decoding";
            pcVar16 = "base64_decode_block_decodes_4_chars";
            goto LAB_00101618;
          }
          iVar4 = hdr_base64_decode((char *)0x0,5,(uint8_t *)0x0,3);
          if (iVar4 == 0) {
            pcVar17 = "Input length % 4 != 0";
          }
          else {
            iVar4 = hdr_base64_decode((char *)0x0,3,(uint8_t *)0x0,3);
            if (iVar4 == 0) {
              pcVar17 = "Input length < 4";
            }
            else {
              iVar4 = hdr_base64_decode((char *)0x0,8,(uint8_t *)0x0,7);
              pcVar17 = "Output length not 3/4 of input length";
              if (iVar4 != 0) {
                pcVar17 = (char *)0x0;
              }
            }
          }
          tests_run = tests_run + 1;
          if (pcVar17 != (char *)0x0) {
            pcVar16 = "base64_decode_fails_with_invalid_lengths";
            goto LAB_00101618;
          }
          _Var3 = assert_base64_decode("YW55IGNhcm5hbCBwbGVhc3Vy","any carnal pleasur");
          tests_run = tests_run + 1;
          pcVar17 = "Encoding without padding";
          if (!_Var3) {
            pcVar16 = "base64_decode_decodes_strings_without_padding";
            goto LAB_00101618;
          }
          _Var3 = assert_base64_decode("YW55IGNhcm5hbCBwbGVhc3VyZS4=","any carnal pleasure.");
          if (_Var3) {
            _Var3 = assert_base64_decode("YW55IGNhcm5hbCBwbGVhc3VyZQ==","any carnal pleasure");
            pcVar14 = (char *)0x0;
            if (!_Var3) {
              pcVar14 = "Encoding with padding \'==\'";
            }
          }
          else {
            pcVar14 = "Encoding with padding \'=\'";
          }
          tests_run = tests_run + 1;
          if (pcVar14 != (char *)0x0) {
            pcVar16 = "base64_decode_decodes_strings_with_padding";
            pcVar17 = pcVar14;
            goto LAB_00101618;
          }
          data = (char *)((ulong)data & 0xffffff0000000000);
          hdr_base64_encode_block((uint8_t *)"Man",(char *)&data);
          _Var3 = compare_string("TWFu",(char *)&data,4);
          tests_run = tests_run + 1;
          if (!_Var3) {
            pcVar17 = "Encoding";
            pcVar16 = "base64_encode_block_encodes_3_bytes";
            goto LAB_00101618;
          }
          iVar4 = hdr_base64_encode((uint8_t *)0x0,9,(char *)0x0,0xb);
          tests_run = tests_run + 1;
          if (iVar4 == 0) {
            pcVar17 = "Output length not 4/3 of input length";
            pcVar16 = "base64_encode_fails_with_invalid_lengths";
            goto LAB_00101618;
          }
          _Var3 = assert_base64_encode("any carnal pleasur","YW55IGNhcm5hbCBwbGVhc3Vy");
          tests_run = tests_run + 1;
          if (!_Var3) {
            pcVar16 = "base64_encode_encodes_without_padding";
            goto LAB_00101618;
          }
          _Var3 = assert_base64_encode("any carnal pleasure.","YW55IGNhcm5hbCBwbGVhc3VyZS4=");
          if (_Var3) {
            _Var3 = assert_base64_encode("any carnal pleasure","YW55IGNhcm5hbCBwbGVhc3VyZQ==");
            pcVar17 = (char *)0x0;
            if (!_Var3) {
              pcVar17 = "Encoding with padding \'==\'";
            }
          }
          else {
            pcVar17 = "Encoding with padding \'=\'";
          }
          tests_run = tests_run + 1;
          if (pcVar17 != (char *)0x0) {
            pcVar16 = "base64_encode_encodes_with_padding";
            goto LAB_00101618;
          }
          hdr_gettime((hdr_timespec *)&data);
          local_a0.tv_sec = 5;
          local_a0.tv_nsec = 2000000;
          hdr_log_writer_init(&writer);
          hdr_log_reader_init(&reader);
          pFVar10 = fopen("histogram.log","w+");
          iVar4 = hdr_log_write_header(&writer,(FILE *)pFVar10,"Test log",(hdr_timespec *)&data);
          _Var3 = validate_return_code(iVar4);
          if (_Var3) {
            local_80 = "tag_value";
            local_78 = 9;
            hdr_log_write_entry(&writer,(FILE *)pFVar10,(hdr_log_entry *)&data,cor_histogram);
            _Var3 = validate_return_code(iVar4);
            if (!_Var3) {
              pcVar17 = "Failed corrected write";
              goto LAB_00101dd9;
            }
            local_80 = (char *)0x0;
            hdr_log_write_entry(&writer,(FILE *)pFVar10,(hdr_log_entry *)&data,raw_histogram);
            _Var3 = validate_return_code(iVar4);
            if (!_Var3) {
              pcVar17 = "Failed raw write";
              goto LAB_00101dd9;
            }
            fputc(10,pFVar10);
            fflush(pFVar10);
            fclose(pFVar10);
            pFVar10 = fopen("histogram.log","r");
            read_cor_histogram = (hdr_histogram *)0x0;
            read_raw_histogram = (hdr_histogram *)0x0;
            iVar4 = hdr_log_read_header(&reader,(FILE *)pFVar10);
            _Var3 = validate_return_code(iVar4);
            if (!_Var3) {
              pcVar17 = "Failed header read";
              goto LAB_00101dd9;
            }
            _Var3 = compare_int(reader.major_version,1);
            if (!_Var3) {
              pcVar17 = "Incorrect major version";
              goto LAB_00101dd9;
            }
            _Var3 = compare_int(reader.minor_version,2);
            if (!_Var3) {
              pcVar17 = "Incorrect minor version";
              goto LAB_00101dd9;
            }
            _Var3 = compare_timespec(&reader.start_timestamp,(hdr_timespec *)&data);
            if (!_Var3) {
              pcVar17 = "Incorrect start timestamp";
              goto LAB_00101dd9;
            }
            local_c8 = 0x20;
            actual = (hdr_histogram *)((ulong)actual & 0xffffffffffffff00);
            local_109 = 0;
            local_d0 = &actual;
            iVar4 = hdr_log_read_entry(&reader,(FILE *)pFVar10,(hdr_log_entry *)&histogram,
                                       &read_cor_histogram);
            _Var3 = validate_return_code(iVar4);
            if (!_Var3) {
              pcVar17 = "Failed corrected read";
              goto LAB_00101dd9;
            }
            _Var3 = compare_timespec((hdr_timespec *)&histogram,(hdr_timespec *)&data);
            if (!_Var3) {
              pcVar17 = "Incorrect first timestamp";
              goto LAB_00101dd9;
            }
            _Var3 = compare_timespec(local_f0,&local_a0);
            if (!_Var3) {
              pcVar17 = "Incorrect first interval";
              goto LAB_00101dd9;
            }
            _Var3 = compare_string((char *)local_d0,"tag_value",9);
            if (!_Var3) {
              pcVar17 = "Incorrect tag";
              goto LAB_00101dd9;
            }
            *(undefined1 *)local_d0 = 0;
            *(undefined1 *)((long)local_d0 + (local_c8 - 1)) = 0;
            iVar4 = hdr_log_read_entry(&reader,(FILE *)pFVar10,(hdr_log_entry *)&histogram,
                                       &read_raw_histogram);
            if (*(char *)local_d0 != '\0') {
              pcVar17 = "Should not find tag";
              goto LAB_00101dd9;
            }
            _Var3 = validate_return_code(iVar4);
            if (!_Var3) {
              pcVar17 = "Failed raw read";
              goto LAB_00101dd9;
            }
            _Var3 = compare_histogram(cor_histogram,read_cor_histogram);
            pcVar17 = "Histograms do not match";
            if ((!_Var3) || (_Var3 = compare_histogram(raw_histogram,read_raw_histogram), !_Var3))
            goto LAB_00101dd9;
            iVar4 = hdr_log_read(&reader,(FILE *)pFVar10,&read_cor_histogram,(hdr_timespec *)0x0,
                                 (hdr_timespec *)0x0);
            if (iVar4 != -1) {
              pcVar17 = "No EOF at end of file";
              goto LAB_00101dd9;
            }
            fclose(pFVar10);
            remove("histogram.log");
            tests_run = tests_run + 1;
            hdr_gettime((hdr_timespec *)&actual);
            reader.major_version = 5;
            reader.minor_version = 0;
            reader.start_timestamp.tv_sec = 2000000;
            hdr_log_writer_init((hdr_log_writer *)&read_raw_histogram);
            hdr_log_reader_init((hdr_log_reader *)&histogram);
            pFVar10 = fopen("histogram.log","w+");
            hdr_log_write_header
                      ((hdr_log_writer *)&read_raw_histogram,(FILE *)pFVar10,"Test log",
                       (hdr_timespec *)&actual);
            hdr_log_write((hdr_log_writer *)&read_raw_histogram,(FILE *)pFVar10,
                          (hdr_timespec *)&actual,(hdr_timespec *)&reader,cor_histogram);
            hdr_log_write((hdr_log_writer *)&read_raw_histogram,(FILE *)pFVar10,
                          (hdr_timespec *)&actual,(hdr_timespec *)&reader,raw_histogram);
            fflush(pFVar10);
            fclose(pFVar10);
            pFVar10 = fopen("histogram.log","r");
            hdr_alloc(3600000000,3,&read_cor_histogram);
            iVar4 = hdr_log_read_header((hdr_log_reader *)&histogram,(FILE *)pFVar10);
            _Var3 = validate_return_code(iVar4);
            if (_Var3) {
              iVar4 = hdr_log_read((hdr_log_reader *)&histogram,(FILE *)pFVar10,&read_cor_histogram,
                                   (hdr_timespec *)0x0,(hdr_timespec *)0x0);
              _Var3 = validate_return_code(iVar4);
              if (_Var3) {
                iVar4 = hdr_log_read((hdr_log_reader *)&histogram,(FILE *)pFVar10,
                                     &read_cor_histogram,(hdr_timespec *)0x0,(hdr_timespec *)0x0);
                _Var3 = validate_return_code(iVar4);
                if (_Var3) {
                  hdr_iter_recorded_init((hdr_iter *)&data,read_cor_histogram);
                  _Var3 = compare_int64(read_cor_histogram->total_count,
                                        cor_histogram->total_count + raw_histogram->total_count);
                  if (_Var3) {
                    pcVar17 = "Incorrect count";
LAB_00101fd4:
                    _Var3 = hdr_iter_next((hdr_iter *)&data);
                    iVar12 = local_88;
                    a = local_a0.tv_nsec;
                    if (_Var3) goto code_r0x00101fe5;
                    fclose(pFVar10);
                    remove("histogram.log");
                    free(read_cor_histogram);
                    tests_run = tests_run + 1;
                    pFVar10 = fopen("histogram_with_invalid_version.log","w+");
                    fputs("#[Test log]\n#[Histogram log format version 1.04]\n#[StartTime: 1404700005.222 (seconds since epoch), Mon Jul 02:26:45 GMT 2014]\nStartTimestamp\",\"EndTimestamp\",\"Interval_Max\",\"Interval_Compressed_Histogram\"\n"
                          ,pFVar10);
                    fflush(pFVar10);
                    fclose(pFVar10);
                    pFVar10 = fopen("histogram_with_invalid_version.log","r");
                    hdr_log_reader_init((hdr_log_reader *)&data);
                    iVar4 = hdr_log_read_header((hdr_log_reader *)&data,(FILE *)pFVar10);
                    if (iVar4 != -0x7529) {
                      pcVar17 = "Should error with incorrect version";
                      pcVar16 = "log_reader_fails_with_incorrect_version";
                      goto LAB_00101612;
                    }
                    fclose(pFVar10);
                    remove("histogram_with_invalid_version.log");
                    tests_run = tests_run + 1;
                    actual = (hdr_histogram *)0x0;
                    hdr_alloc(3600000000,3,&histogram);
                    for (; lVar15 != 100; lVar15 = lVar15 + 1) {
                      hdr_record_value(histogram,lVar15 * lVar15);
                    }
                    iVar4 = hdr_log_encode(histogram,&data);
                    pcVar17 = data;
                    if (iVar4 == 0) {
                      sVar6 = strlen(data);
                      iVar4 = hdr_log_decode(&actual,pcVar17,sVar6);
                      if (iVar4 == 0) {
                        _Var3 = compare_histogram(histogram,actual);
                        if (_Var3) {
                          local_c0 = hdr_mean(histogram);
                          dVar19 = hdr_mean(actual);
                          _Var3 = compare_double(local_c0,dVar19,0.001);
                          pcVar17 = (char *)0x0;
                          if (!_Var3) {
                            pcVar17 = "Mean different after encode/decode";
                          }
                        }
                        else {
                          pcVar17 = "Histograms should be the same";
                        }
                      }
                      else {
                        pcVar17 = "Failed to decode histogram data";
                      }
                    }
                    else {
                      pcVar17 = "Failed to encode histogram data";
                    }
                    tests_run = tests_run + 1;
                    if (pcVar17 == (char *)0x0) {
                      actual = (hdr_histogram *)0x0;
                      hdr_alloc(1000,3,&histogram);
                      for (lVar15 = 1; lVar15 < histogram->highest_trackable_value;
                          lVar15 = lVar15 + 1) {
                        hdr_record_value(histogram,lVar15);
                      }
                      iVar4 = hdr_log_encode(histogram,&data);
                      _Var3 = validate_return_code(iVar4);
                      pcVar17 = data;
                      if (_Var3) {
                        sVar6 = strlen(data);
                        iVar4 = hdr_log_decode(&actual,pcVar17,sVar6);
                        _Var3 = validate_return_code(iVar4);
                        if (_Var3) {
                          _Var3 = compare_histogram(histogram,actual);
                          if (_Var3) {
                            local_c0 = hdr_mean(histogram);
                            dVar19 = hdr_mean(actual);
                            _Var3 = compare_double(local_c0,dVar19,0.001);
                            pcVar17 = (char *)0x0;
                            if (!_Var3) {
                              pcVar17 = "Mean different after encode/decode";
                            }
                          }
                          else {
                            pcVar17 = "Histograms should be the same";
                          }
                        }
                        else {
                          pcVar17 = "Failed to decode histogram data";
                        }
                      }
                      else {
                        pcVar17 = "Failed to encode histogram data";
                      }
                      tests_run = tests_run + 1;
                      if (pcVar17 != (char *)0x0) {
                        pcVar16 = "test_string_encode_decode_2";
                        goto LAB_00101618;
                      }
                      read_cor_histogram = (hdr_histogram *)0x0;
                      file = fopen("jHiccup-2.0.7S.logV3.hlog","r");
                      pFVar10 = _stderr;
                      if (file == (FILE *)0x0) {
                        puVar13 = (uint *)__errno_location();
                        __errnum = *puVar13;
                        pcVar17 = strerror(__errnum);
                        fprintf(pFVar10,"Open file: [%d] %s",(ulong)__errnum,pcVar17);
                        pcVar17 = "Can not open v3 log file";
                      }
                      else {
                        hdr_init(1,3600000000000,3,(hdr_histogram **)&reader);
                        hdr_log_reader_init((hdr_log_reader *)&data);
                        iVar4 = hdr_log_read_header((hdr_log_reader *)&data,(FILE *)file);
                        _Var3 = validate_return_code(iVar4);
                        if (_Var3) {
                          lVar15 = 0;
                          pcVar17 = "Failed to read histogram";
                          iVar4 = 0;
                          while (iVar5 = hdr_log_read((hdr_log_reader *)&data,(FILE *)file,
                                                      &read_cor_histogram,(hdr_timespec *)&histogram
                                                      ,(hdr_timespec *)&actual), iVar5 != -1) {
                            _Var3 = validate_return_code(iVar5);
                            if (!_Var3) goto LAB_00102521;
                            lVar1 = read_cor_histogram->total_count;
                            iVar12 = hdr_add((hdr_histogram *)reader._0_8_,read_cor_histogram);
                            _Var3 = compare_int64(iVar12,0);
                            if (!_Var3) {
                              pcVar17 = "Dropped events";
                              goto LAB_00102521;
                            }
                            lVar15 = lVar15 + lVar1;
                            iVar4 = iVar4 + 1;
                            free(read_cor_histogram);
                            read_cor_histogram = (hdr_histogram *)0x0;
                          }
                          _Var3 = compare_int(iVar4,0x3e);
                          if (_Var3) {
                            _Var3 = compare_int64(lVar15,0xbe79);
                            if (_Var3) {
                              iVar12 = hdr_value_at_percentile((hdr_histogram *)reader._0_8_,99.9);
                              _Var3 = compare_int64(0x680fffff,iVar12);
                              if (_Var3) {
                                iVar12 = hdr_max((hdr_histogram *)reader._0_8_);
                                _Var3 = compare_int64(0x6b0fffff,iVar12);
                                if (_Var3) {
                                  _Var3 = compare_int64(0x55f04f37,local_a8);
                                  if (_Var3) {
                                    _Var3 = compare_int64(474000000,local_a0.tv_sec);
                                    pcVar17 = (char *)0x0;
                                    if (!_Var3) {
                                      pcVar17 = "Nanoseconds wrong";
                                    }
                                  }
                                  else {
                                    pcVar17 = "Seconds wrong";
                                  }
                                }
                                else {
                                  pcVar17 = "max value wrong";
                                }
                              }
                              else {
                                pcVar17 = "99.9 percentile wrong";
                              }
                            }
                            else {
                              pcVar17 = "Wrong total count";
                            }
                          }
                          else {
                            pcVar17 = "Wrong number of histograms";
                          }
                        }
                        else {
                          pcVar17 = "Failed to read header";
                        }
                      }
LAB_00102521:
                      tests_run = tests_run + 1;
                      if (pcVar17 == (char *)0x0) {
                        read_cor_histogram = (hdr_histogram *)0x0;
                        pFVar10 = fopen("jHiccup-2.0.7S.logV2.hlog","r");
                        if (pFVar10 == (FILE *)0x0) {
                          pcVar17 = "Can not open v2 log file";
                        }
                        else {
                          hdr_init(1,3600000000000,3,(hdr_histogram **)&reader);
                          hdr_log_reader_init((hdr_log_reader *)&data);
                          iVar4 = hdr_log_read_header((hdr_log_reader *)&data,(FILE *)pFVar10);
                          _Var3 = validate_return_code(iVar4);
                          if (_Var3) {
                            lVar15 = 0;
                            pcVar17 = "Failed to read histogram";
                            iVar4 = 0;
                            while (iVar5 = hdr_log_read((hdr_log_reader *)&data,(FILE *)pFVar10,
                                                        &read_cor_histogram,
                                                        (hdr_timespec *)&histogram,
                                                        (hdr_timespec *)&actual), iVar5 != -1) {
                              _Var3 = validate_return_code(iVar5);
                              if (!_Var3) goto LAB_00102704;
                              lVar1 = read_cor_histogram->total_count;
                              iVar12 = hdr_add((hdr_histogram *)reader._0_8_,read_cor_histogram);
                              _Var3 = compare_int64(iVar12,0);
                              if (!_Var3) {
                                pcVar17 = "Dropped events";
                                goto LAB_00102704;
                              }
                              lVar15 = lVar15 + lVar1;
                              iVar4 = iVar4 + 1;
                              free(read_cor_histogram);
                              read_cor_histogram = (hdr_histogram *)0x0;
                            }
                            _Var3 = compare_int(iVar4,0x3e);
                            if (_Var3) {
                              _Var3 = compare_int64(lVar15,0xbe79);
                              if (_Var3) {
                                iVar12 = hdr_value_at_percentile((hdr_histogram *)reader._0_8_,99.9)
                                ;
                                _Var3 = compare_int64(0x680fffff,iVar12);
                                if (_Var3) {
                                  iVar12 = hdr_max((hdr_histogram *)reader._0_8_);
                                  _Var3 = compare_int64(0x6b0fffff,iVar12);
                                  if (_Var3) {
                                    _Var3 = compare_int64(0x55f04f37,local_a8);
                                    if (_Var3) {
                                      _Var3 = compare_int64(474000000,local_a0.tv_sec);
                                      pcVar17 = (char *)0x0;
                                      if (!_Var3) {
                                        pcVar17 = "Nanoseconds wrong";
                                      }
                                    }
                                    else {
                                      pcVar17 = "Seconds wrong";
                                    }
                                  }
                                  else {
                                    pcVar17 = "max value wrong";
                                  }
                                }
                                else {
                                  pcVar17 = "99.9 percentile wrong";
                                }
                              }
                              else {
                                pcVar17 = "Wrong total count";
                              }
                            }
                            else {
                              pcVar17 = "Wrong number of histograms";
                            }
                          }
                          else {
                            pcVar17 = "Failed to read header";
                          }
                        }
LAB_00102704:
                        tests_run = tests_run + 1;
                        if (pcVar17 == (char *)0x0) {
                          read_cor_histogram = (hdr_histogram *)0x0;
                          pFVar10 = fopen("jHiccup-2.0.6.logV1.hlog","r");
                          if (pFVar10 == (FILE *)0x0) {
                            pcVar17 = "Can not open v1 log file";
                          }
                          else {
                            hdr_init(1,3600000000000,3,(hdr_histogram **)&reader);
                            hdr_log_reader_init((hdr_log_reader *)&data);
                            iVar4 = hdr_log_read_header((hdr_log_reader *)&data,(FILE *)pFVar10);
                            if (iVar4 == 0) {
                              lVar15 = 0;
                              pcVar17 = "Failed to read histogram";
                              iVar4 = 0;
                              while (iVar5 = hdr_log_read((hdr_log_reader *)&data,(FILE *)pFVar10,
                                                          &read_cor_histogram,
                                                          (hdr_timespec *)&histogram,
                                                          (hdr_timespec *)&actual), iVar5 == 0) {
                                lVar1 = read_cor_histogram->total_count;
                                iVar12 = hdr_add((hdr_histogram *)reader._0_8_,read_cor_histogram);
                                _Var3 = compare_int64(iVar12,0);
                                if (!_Var3) {
                                  pcVar17 = "Dropped events";
                                  goto LAB_001028d1;
                                }
                                lVar15 = lVar15 + lVar1;
                                iVar4 = iVar4 + 1;
                                free(read_cor_histogram);
                                read_cor_histogram = (hdr_histogram *)0x0;
                              }
                              if (iVar5 == -1) {
                                _Var3 = compare_int(iVar4,0x58);
                                if (_Var3) {
                                  _Var3 = compare_int64(lVar15,0x101ac);
                                  if (_Var3) {
                                    iVar12 = hdr_value_at_percentile
                                                       ((hdr_histogram *)reader._0_8_,99.9);
                                    _Var3 = compare_int64(0x6d0fffff,iVar12);
                                    if (_Var3) {
                                      iVar12 = hdr_max((hdr_histogram *)reader._0_8_);
                                      _Var3 = compare_int64(0x708fffff,iVar12);
                                      if (_Var3) {
                                        _Var3 = compare_int64(0x55c36086,local_a8);
                                        if (_Var3) {
                                          _Var3 = compare_int64(285000000,local_a0.tv_sec);
                                          pcVar17 = (char *)0x0;
                                          if (!_Var3) {
                                            pcVar17 = "Nanoseconds wrong";
                                          }
                                        }
                                        else {
                                          pcVar17 = "Seconds wrong";
                                        }
                                      }
                                      else {
                                        pcVar17 = "max value wrong";
                                      }
                                    }
                                    else {
                                      pcVar17 = "99.9 percentile wrong";
                                    }
                                  }
                                  else {
                                    pcVar17 = "Wrong total count";
                                  }
                                }
                                else {
                                  pcVar17 = "Wrong number of histograms";
                                }
                              }
                            }
                            else {
                              pcVar17 = "Failed to read header";
                            }
                          }
LAB_001028d1:
                          tests_run = tests_run + 1;
                          if (pcVar17 == (char *)0x0) {
                            read_cor_histogram = (hdr_histogram *)0x0;
                            pFVar10 = fopen("jHiccup-2.0.1.logV0.hlog","r");
                            if (pFVar10 == (FILE *)0x0) {
                              pcVar17 = "Can not open v1 log file";
                            }
                            else {
                              hdr_init(1,3600000000000,3,(hdr_histogram **)&reader);
                              hdr_log_reader_init((hdr_log_reader *)&data);
                              iVar4 = hdr_log_read_header((hdr_log_reader *)&data,(FILE *)pFVar10);
                              if (iVar4 == 0) {
                                iVar4 = 0;
                                pcVar17 = "Failed to read histogram";
                                lVar15 = 0;
                                while (iVar5 = hdr_log_read((hdr_log_reader *)&data,(FILE *)pFVar10,
                                                            &read_cor_histogram,
                                                            (hdr_timespec *)&histogram,
                                                            (hdr_timespec *)&actual), iVar5 == 0) {
                                  lVar1 = read_cor_histogram->total_count;
                                  iVar12 = hdr_add((hdr_histogram *)reader._0_8_,read_cor_histogram)
                                  ;
                                  _Var3 = compare_int64(iVar12,0);
                                  if (!_Var3) {
                                    pcVar17 = "Dropped events";
                                    goto LAB_00102aa0;
                                  }
                                  lVar15 = lVar15 + lVar1;
                                  iVar4 = iVar4 + 1;
                                  free(read_cor_histogram);
                                  read_cor_histogram = (hdr_histogram *)0x0;
                                }
                                if (iVar5 == -1) {
                                  _Var3 = compare_int(iVar4,0x51);
                                  if (_Var3) {
                                    _Var3 = compare_int64(lVar15,0xef48);
                                    if (_Var3) {
                                      iVar12 = hdr_value_at_percentile
                                                         ((hdr_histogram *)reader._0_8_,99.9);
                                      _Var3 = compare_int64(0x5a0fffff,iVar12);
                                      if (_Var3) {
                                        iVar12 = hdr_max((hdr_histogram *)reader._0_8_);
                                        _Var3 = compare_int64(0x5d8fffff,iVar12);
                                        if (_Var3) {
                                          _Var3 = compare_int64(0x55c369c9,local_a8);
                                          if (_Var3) {
                                            _Var3 = compare_int64(225000000,local_a0.tv_sec);
                                            pcVar17 = (char *)0x0;
                                            if (!_Var3) {
                                              pcVar17 = "Nanoseconds wrong";
                                            }
                                          }
                                          else {
                                            pcVar17 = "Seconds wrong";
                                          }
                                        }
                                        else {
                                          pcVar17 = "max value wrong";
                                        }
                                      }
                                      else {
                                        pcVar17 = "99.9 percentile wrong";
                                      }
                                    }
                                    else {
                                      pcVar17 = "Wrong total count";
                                    }
                                  }
                                  else {
                                    pcVar17 = "Wrong number of histograms";
                                  }
                                }
                              }
                              else {
                                pcVar17 = "Failed to read header";
                              }
                            }
LAB_00102aa0:
                            tests_run = tests_run + 1;
                            if (pcVar17 == (char *)0x0) {
                              iVar4 = parse_line_from_file("test_tagged_invalid_histogram.txt");
                              if (iVar4 == -0x16) {
                                iVar4 = parse_line_from_file("test_tagged_invalid_tag_key.txt");
                                if (iVar4 == -0x16) {
                                  iVar4 = parse_line_from_file("test_tagged_invalid_timestamp.txt");
                                  if (iVar4 == -0x16) {
                                    iVar4 = parse_line_from_file
                                                      ("test_tagged_missing_histogram.txt");
                                    pcVar17 = (char *)0x0;
                                    if (iVar4 != -0x16) {
                                      pcVar17 = "Should have missing histogram";
                                    }
                                  }
                                  else {
                                    pcVar17 = "Should have invalid timestamp";
                                  }
                                }
                                else {
                                  pcVar17 = "Should have invalid tag key";
                                }
                              }
                              else {
                                pcVar17 = "Should have invalid histogram";
                              }
                              tests_run = tests_run + 1;
                              if (pcVar17 == (char *)0x0) {
                                histogram = (hdr_histogram *)0x0;
                                free(raw_histogram);
                                iVar4 = hdr_init(1,1000000,1,&raw_histogram);
                                if (iVar4 == 0) {
                                  iVar4 = hdr_encode_compressed
                                                    (raw_histogram,(uint8_t **)&data,
                                                     (size_t *)&histogram);
                                  _Var3 = validate_return_code(iVar4);
                                  if (_Var3) {
                                    sVar7 = hdr_base64_encoded_len((size_t)histogram);
                                    sVar8 = hdr_base64_decoded_len(sVar7);
                                    pcVar17 = (char *)calloc(sVar7 + 1,1);
                                    puVar9 = (uint8_t *)calloc(sVar8,1);
                                    hdr_base64_encode((uint8_t *)data,(size_t)histogram,pcVar17,
                                                      sVar7);
                                    hdr_base64_decode(pcVar17,sVar7,puVar9,sVar8);
                                    iVar4 = bcmp(data,puVar9,(size_t)histogram);
                                    pcVar17 = (char *)0x0;
                                    if (iVar4 != 0) {
                                      pcVar17 = "Should be same";
                                    }
                                  }
                                  else {
                                    pcVar17 = "Did not encode";
                                  }
                                }
                                else {
                                  pcVar17 = "allocation should be valid";
                                }
                                tests_run = tests_run + 1;
                                if (pcVar17 == (char *)0x0) {
                                  free(raw_histogram);
                                  free(cor_histogram);
                                  puts("ALL TESTS PASSED");
                                  iVar4 = 0;
                                  goto LAB_0010162c;
                                }
                                pcVar16 = "test_encode_and_decode_empty";
                              }
                              else {
                                pcVar16 = "handle_invalid_log_lines";
                              }
                            }
                            else {
                              pcVar16 = "decode_v0_log";
                            }
                          }
                          else {
                            pcVar16 = "decode_v1_log";
                          }
                        }
                        else {
                          pcVar16 = "decode_v2_log";
                        }
                      }
                      else {
                        pcVar16 = "decode_v3_log";
                      }
                    }
                    else {
                      pcVar16 = "test_string_encode_decode";
                    }
                    goto LAB_00101618;
                  }
                  pcVar17 = "Total counts incorrect";
                }
                else {
                  pcVar17 = "Failed raw read";
                }
              }
              else {
                pcVar17 = "Failed corrected read";
              }
            }
            else {
              pcVar17 = "Failed header read";
            }
LAB_0010204c:
            pcVar16 = "log_reader_aggregates_into_single_histogram";
          }
          else {
            pcVar17 = "Failed header write";
LAB_00101dd9:
            pcVar16 = "writes_and_reads_log";
          }
        }
        else {
          pcVar17 = "Did not encode";
LAB_00101818:
          pcVar16 = "test_encode_and_decode_compressed_large";
        }
      }
      else {
        pcVar17 = "Did not encode";
LAB_001016a1:
        pcVar16 = "test_encode_and_decode_compressed2";
      }
    }
    else {
      pcVar17 = "Did not encode";
LAB_00101676:
      pcVar16 = "test_encode_and_decode_compressed";
    }
  }
  else {
    pcVar17 = "Failed to encode histogram data";
LAB_0010160b:
    pcVar16 = "test_encode_decode_empty";
  }
LAB_00101612:
  tests_run = tests_run + 1;
LAB_00101618:
  printf("hdr_histogram_log_test.%s(): %s\n",pcVar16,pcVar17);
  iVar4 = -1;
LAB_0010162c:
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return iVar4;
code_r0x00101fe5:
  iVar11 = hdr_count_at_value(raw_histogram,local_88);
  iVar12 = hdr_count_at_value(cor_histogram,iVar12);
  _Var3 = compare_int64(a,iVar11 + iVar12);
  if (!_Var3) goto LAB_0010204c;
  goto LAB_00101fd4;
}

Assistant:

static struct mu_result all_tests(void)
{
    tests_run = 0;

    mu_run_test(test_encode_decode_empty);
    mu_run_test(test_encode_and_decode_compressed);
    mu_run_test(test_encode_and_decode_compressed2);
    mu_run_test(test_encode_and_decode_compressed_large);
    mu_run_test(test_encode_and_decode_base64);
    mu_run_test(test_bounds_check_on_decode);

    mu_run_test(base64_decode_block_decodes_4_chars);
    mu_run_test(base64_decode_fails_with_invalid_lengths);
    mu_run_test(base64_decode_decodes_strings_without_padding);
    mu_run_test(base64_decode_decodes_strings_with_padding);

    mu_run_test(base64_encode_block_encodes_3_bytes);
    mu_run_test(base64_encode_fails_with_invalid_lengths);
    mu_run_test(base64_encode_encodes_without_padding);
    mu_run_test(base64_encode_encodes_with_padding);

    mu_run_test(writes_and_reads_log);
    mu_run_test(log_reader_aggregates_into_single_histogram);
    mu_run_test(log_reader_fails_with_incorrect_version);

    mu_run_test(test_string_encode_decode);
    mu_run_test(test_string_encode_decode_2);

    mu_run_test(decode_v3_log);
    mu_run_test(decode_v2_log);
    mu_run_test(decode_v1_log);
    mu_run_test(decode_v0_log);
    mu_run_test(handle_invalid_log_lines);

    mu_run_test(test_encode_and_decode_empty);

    free(raw_histogram);
    free(cor_histogram);

    mu_ok;
}